

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineCache.cpp
# Opt level: O1

bool __thiscall
Js::InlineCache::HasDifferentType<false>
          (InlineCache *this,bool isProto,Type *type,Type *typeWithoutProperty)

{
  Type *pTVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  Type *pTVar5;
  
  if (typeWithoutProperty != (Type *)0x0 && isProto) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                ,0x201,"(!isAccessor && !isProto || !typeWithoutProperty)",
                                "!isAccessor && !isProto || !typeWithoutProperty");
    if (!bVar3) goto LAB_009852a5;
    *puVar4 = 0;
  }
  if (isProto) {
    if (((this->u).local.type == (Type *)0x0) ||
       (pTVar5 = (this->u).local.typeWithoutProperty, pTVar5 == type)) {
      return false;
    }
  }
  else {
    pTVar5 = (this->u).local.typeWithoutProperty;
    if ((typeWithoutProperty != (Type *)0x0 && pTVar5 != (Type *)0x0) &&
       ((pTVar1 = (this->u).local.type, pTVar5 != typeWithoutProperty && pTVar1 == type ||
        (pTVar5 != (Type *)((ulong)typeWithoutProperty | 4) && pTVar1 == (Type *)((ulong)type | 4)))
       )) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/InlineCache.cpp"
                                  ,0x20f,
                                  "((u.local.typeWithoutProperty == nullptr || typeWithoutProperty == nullptr) || ((u.local.type != type || u.local.typeWithoutProperty == typeWithoutProperty) && (u.local.type != (reinterpret_cast<Type*>(reinterpret_cast<size_t>(type) | 4)) || u.local.typeWithoutProperty == (reinterpret_cast<Type*>(reinterpret_cast<size_t>(typeWithoutProperty) | 4)))))"
                                  ,
                                  "(u.local.typeWithoutProperty == nullptr || typeWithoutProperty == nullptr) || ((u.local.type != type || u.local.typeWithoutProperty == typeWithoutProperty) && (u.local.type != TypeWithAuxSlotTag(type) || u.local.typeWithoutProperty == TypeWithAuxSlotTag(typeWithoutProperty)))"
                                 );
      if (!bVar3) {
LAB_009852a5:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    pTVar5 = (this->u).local.type;
    if (pTVar5 == type || pTVar5 == (Type *)0x0) {
      return false;
    }
  }
  return pTVar5 != (Type *)((ulong)type | 4);
}

Assistant:

bool InlineCache::HasDifferentType(const bool isProto, const Type * type, const Type * typeWithoutProperty) const
    {
        Assert(!isAccessor && !isProto || !typeWithoutProperty);

        if (isAccessor)
        {
            return !IsEmpty() && u.accessor.type != type && u.accessor.type != TypeWithAuxSlotTag(type);
        }
        if (isProto)
        {
            return !IsEmpty() && u.proto.type != type && u.proto.type != TypeWithAuxSlotTag(type);
        }

        // If the new type matches the cached type, the types without property must also match (unless one of them is null).
        Assert((u.local.typeWithoutProperty == nullptr || typeWithoutProperty == nullptr) ||
            ((u.local.type != type || u.local.typeWithoutProperty == typeWithoutProperty) &&
                (u.local.type != TypeWithAuxSlotTag(type) || u.local.typeWithoutProperty == TypeWithAuxSlotTag(typeWithoutProperty))));

        // Don't consider a cache polymorphic, if it differs only by the typeWithoutProperty.  We can handle this case with
        // the monomorphic cache.
        return !IsEmpty() && (u.local.type != type && u.local.type != TypeWithAuxSlotTag(type));
    }